

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

QPDFObjectHandle __thiscall QPDF::makeIndirectFromQPDFObject(QPDF *this,shared_ptr<QPDFObject> *obj)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  QPDFObjGen QVar5;
  mapped_type *pmVar6;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObject *__tmp;
  QPDFObjectHandle QVar7;
  QPDFObjGen next;
  QPDFObjGen local_30;
  
  local_30 = nextObjGen((QPDF *)obj);
  peVar1 = (element_type *)*in_RDX;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  pmVar6 = std::
           map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
           ::operator[]((map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                         *)((long)&(obj->super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>)
                                   ._M_ptr[4].value.
                                   super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                   .
                                   super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                   .
                                   super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                   .
                                   super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           + 0x28),&local_30);
  (pmVar6->object).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  this_00 = (pmVar6->object).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (pmVar6->object).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  QVar5 = local_30;
  *(undefined4 *)&pmVar6->end_before_space = 0xffffffff;
  *(undefined4 *)((long)&pmVar6->end_before_space + 4) = 0xffffffff;
  *(undefined4 *)&pmVar6->end_after_space = 0xffffffff;
  *(undefined4 *)((long)&pmVar6->end_after_space + 4) = 0xffffffff;
  pmVar6 = std::
           map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
           ::operator[]((map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                         *)((long)&(obj->super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>)
                                   ._M_ptr[4].value.
                                   super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                   .
                                   super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                   .
                                   super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                   .
                                   super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           + 0x28),&local_30);
  peVar1 = (pmVar6->object).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1->qpdf = (QPDF *)obj;
  peVar1->og = QVar5;
  (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
       (Members *)(pmVar6->object).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  _Var3._M_head_impl =
       (Members *)
       (pmVar6->object).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  this[1].m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var3._M_head_impl != (Members *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var3._M_head_impl)->log + 8);
      *(int *)&p_Var4->_M_pi = *(int *)&p_Var4->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var3._M_head_impl)->log + 8);
      *(int *)&p_Var4->_M_pi = *(int *)&p_Var4->_M_pi + 1;
    }
  }
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::makeIndirectFromQPDFObject(std::shared_ptr<QPDFObject> const& obj)
{
    QPDFObjGen next{nextObjGen()};
    m->obj_cache[next] = ObjCache(obj, -1, -1);
    return newIndirect(next, m->obj_cache[next].object);
}